

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Path> *value)

{
  bool bVar1;
  Path v;
  Path local_e8;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::Path>::reset(value);
    bVar1 = true;
  }
  else {
    local_e8._prim_part._M_dataplus._M_p = (pointer)&local_e8._prim_part.field_2;
    local_e8._prim_part._M_string_length = 0;
    local_e8._prim_part.field_2._M_local_buf[0] = '\0';
    local_e8._prop_part._M_dataplus._M_p = (pointer)&local_e8._prop_part.field_2;
    local_e8._prop_part._M_string_length = 0;
    local_e8._prop_part.field_2._M_local_buf[0] = '\0';
    local_e8._variant_part._M_dataplus._M_p = (pointer)&local_e8._variant_part.field_2;
    local_e8._variant_part._M_string_length = 0;
    local_e8._variant_part.field_2._M_local_buf[0] = '\0';
    local_e8._variant_selection_part._M_dataplus._M_p =
         (pointer)&local_e8._variant_selection_part.field_2;
    local_e8._variant_selection_part._M_string_length = 0;
    local_e8._variant_selection_part.field_2._M_local_buf[0] = '\0';
    local_e8._variant_part_str._M_dataplus._M_p = (pointer)&local_e8._variant_part_str.field_2;
    local_e8._variant_part_str._M_string_length = 0;
    local_e8._variant_part_str.field_2._M_local_buf[0] = '\0';
    local_e8._element._M_dataplus._M_p = (pointer)&local_e8._element.field_2;
    local_e8._element._M_string_length = 0;
    local_e8._element.field_2._M_local_buf[0] = '\0';
    local_e8._path_type.has_value_ = false;
    local_e8._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_e8._valid = false;
    bVar1 = ReadBasicType(this,&local_e8);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::Path>::operator=(value,&local_e8);
    }
    Path::~Path(&local_e8);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Path> *value) {

  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Path v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}